

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_> *
vkt::wsi::anon_unknown_0::generateSwapchainParameterCases
          (vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
           *__return_storage_ptr__,Type wsiType,TestDimension dimension,InstanceInterface *vki,
          VkPhysicalDevice physicalDevice,VkSurfaceKHR surface)

{
  undefined1 local_a8 [8];
  vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> presentModes;
  undefined1 local_88 [8];
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> formats;
  undefined1 local_64 [8];
  VkSurfaceCapabilitiesKHR capabilities;
  VkPhysicalDevice physicalDevice_local;
  InstanceInterface *vki_local;
  TestDimension dimension_local;
  Type wsiType_local;
  VkSurfaceKHR surface_local;
  
  formats.super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)surface.m_internal;
  capabilities._44_8_ = physicalDevice;
  ::vk::wsi::getPhysicalDeviceSurfaceCapabilities
            ((VkSurfaceCapabilitiesKHR *)local_64,vki,physicalDevice,surface);
  presentModes.super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)surface.m_internal;
  ::vk::wsi::getPhysicalDeviceSurfaceFormats
            ((vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *)local_88,vki
             ,(VkPhysicalDevice)capabilities._44_8_,surface);
  ::vk::wsi::getPhysicalDeviceSurfacePresentModes
            ((vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> *)local_a8,vki,
             (VkPhysicalDevice)capabilities._44_8_,surface);
  generateSwapchainParameterCases
            (__return_storage_ptr__,wsiType,dimension,(VkSurfaceCapabilitiesKHR *)local_64,
             (vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *)local_88,
             (vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> *)local_a8);
  std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>::~vector
            ((vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> *)local_a8);
  std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::~vector
            ((vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

vector<VkSwapchainCreateInfoKHR> generateSwapchainParameterCases (Type								wsiType,
																  TestDimension						dimension,
																  const InstanceInterface&			vki,
																  VkPhysicalDevice					physicalDevice,
																  VkSurfaceKHR						surface)
{
	const VkSurfaceCapabilitiesKHR		capabilities	= getPhysicalDeviceSurfaceCapabilities(vki,
																							   physicalDevice,
																							   surface);
	const vector<VkSurfaceFormatKHR>	formats			= getPhysicalDeviceSurfaceFormats(vki,
																						  physicalDevice,
																						  surface);
	const vector<VkPresentModeKHR>		presentModes	= getPhysicalDeviceSurfacePresentModes(vki,
																							   physicalDevice,
																							   surface);

	return generateSwapchainParameterCases(wsiType, dimension, capabilities, formats, presentModes);
}